

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::
SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
::emplace_back<slang::ast::LValue::ArrayLookup>
          (SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
           *this,ArrayLookup *args)

{
  SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
  *in_RDI;
  ArrayLookup *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
  *in_stack_00000030;
  ArrayLookup *in_stack_ffffffffffffffd8;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<slang::ast::LValue::ArrayLookup>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    end(in_RDI);
    std::
    variant<slang::ast::LValue::BitSlice,slang::ast::LValue::ElementIndex,slang::ast::LValue::ArraySlice,slang::ast::LValue::ArrayLookup>
    ::variant<slang::ast::LValue::ArrayLookup,void,void,slang::ast::LValue::ArrayLookup,void>
              ((variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                *)in_RDI,in_stack_ffffffffffffffd8);
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }